

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56TlvY::emulate_mthd(MthdD3D56TlvY *this)

{
  byte bVar1;
  ushort local_12;
  int vidx;
  uint16_t tv;
  MthdD3D56TlvY *this_local;
  
  local_12 = nv03_pgraph_convert_xy((this->super_SingleMthdTest).super_MthdTest.val);
  if ((((this->super_SingleMthdTest).super_MthdTest.cls != 0x48) &&
      ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_a << 0x31
             ) < 0)) &&
     (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format & 1) != 0)) {
    if ((local_12 < 0x8000) || (0x8007 < local_12)) {
      local_12 = local_12 - 8;
    }
    else {
      local_12 = 0x8000;
    }
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_xy =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_xy & 0xffff |
       (uint)local_12 << 0x10;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffffffef | 0x10;
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
    bVar1 = (byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  d3d56_tlv_fog_tri_col1 & 0xf;
  }
  else {
    bVar1 = (byte)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] &
       ((uint)(1L << (bVar1 & 0x3f)) ^ 0xffffffff) | (uint)(0L << (bVar1 & 0x3f));
  return;
}

Assistant:

void emulate_mthd() override {
		uint16_t tv = nv03_pgraph_convert_xy(val);
		if (cls != 0x48 && extr(exp.debug_a, 14, 1) && exp.dvd_format & 1) {
			if (tv >= 0x8000 && tv < 0x8008)
				tv = 0x8000;
			else
				tv -= 8;
		}
		insrt(exp.d3d56_tlv_xy, 16, 16, tv);
		insrt(exp.valid[1], 4, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.d3d56_tlv_fog_tri_col1, 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}